

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderbuffers.cpp
# Opt level: O2

GLuint __thiscall
FGLRenderBuffers::CreateRenderBuffer
          (FGLRenderBuffers *this,FString *name,GLuint format,int width,int height)

{
  GLuint handle;
  
  handle = 0;
  (*_ptrc_glGenRenderbuffers)(1,&handle);
  (*_ptrc_glBindRenderbuffer)(0x8d41,handle);
  FGLDebug::LabelObject(0x8d41,handle,name);
  (*_ptrc_glRenderbufferStorage)(0x8d41,format,width,height);
  return handle;
}

Assistant:

GLuint FGLRenderBuffers::CreateRenderBuffer(const FString &name, GLuint format, int width, int height)
{
	GLuint handle = 0;
	glGenRenderbuffers(1, &handle);
	glBindRenderbuffer(GL_RENDERBUFFER, handle);
	FGLDebug::LabelObject(GL_RENDERBUFFER, handle, name);
	glRenderbufferStorage(GL_RENDERBUFFER, format, width, height);
	return handle;
}